

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grid.cpp
# Opt level: O1

void __thiscall cg_box::cg_box(cg_box *this,s_i raw,int sep,int just,int fill,bool *empty)

{
  cg_box *pcVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  bool bVar11;
  s_i local_68;
  int local_44;
  bool *local_40;
  cg_box *local_38;
  
  local_68.s = raw.s;
  local_68.utf8 = raw.utf8;
  local_68._9_7_ = raw._9_7_;
  local_68.i = raw.i;
  iVar8 = 0;
  iVar9 = 0;
  iVar10 = 0;
  local_44 = just;
  local_40 = empty;
  local_38 = this;
  if (raw.i < ((raw.s)->_M_dataplus)._M_p + (raw.s)->_M_string_length) {
    iVar10 = 0;
    iVar9 = 0;
    iVar8 = 0;
    do {
      iVar2 = s_i::get(&local_68);
      iVar3 = iVar8;
      if (iVar8 < iVar10) {
        iVar3 = iVar10;
      }
      iVar8 = iVar8 + 1;
      if (iVar2 == sep) {
        iVar8 = 0;
        iVar10 = iVar3;
      }
      iVar9 = iVar9 + (uint)(iVar2 == sep);
    } while (local_68.i < ((local_68.s)->_M_dataplus)._M_p + (local_68.s)->_M_string_length);
  }
  pcVar1 = local_38;
  iVar3 = iVar8;
  if (iVar8 < iVar10) {
    iVar3 = iVar10;
  }
  bVar11 = iVar8 != 0;
  if (!bVar11) {
    iVar3 = iVar10;
  }
  *local_40 = iVar3 < 1;
  if (iVar3 < 1) {
    fill = -0x80000000;
  }
  iVar10 = 1;
  if (1 < iVar3) {
    iVar10 = iVar3;
  }
  iVar8 = iVar9 + (uint)bVar11 + (uint)(iVar9 + (uint)bVar11 == 0);
  local_38->w = iVar10;
  local_38->h = iVar8;
  piVar4 = (int *)operator_new__((ulong)(uint)(iVar8 * iVar10) << 2);
  iVar10 = local_44;
  pcVar1->data = piVar4;
  uVar5 = pcVar1->h * pcVar1->w;
  if (0 < (int)uVar5) {
    uVar7 = 0;
    do {
      piVar4[uVar7] = fill;
      uVar7 = uVar7 + 1;
    } while (uVar5 != uVar7);
  }
  local_68.s = raw.s;
  local_68.utf8 = raw.utf8;
  local_68._9_7_ = raw._9_7_;
  local_68.i = raw.i;
  if (raw.i < ((raw.s)->_M_dataplus)._M_p + (raw.s)->_M_string_length) {
    uVar5 = 0;
    iVar8 = 0;
    do {
      iVar9 = s_i::get(&local_68);
      if (iVar9 == sep) {
        iVar8 = iVar8 + 1;
        uVar5 = 0;
      }
      else {
        uVar6 = ~uVar5 + pcVar1->w;
        if (iVar10 != 1) {
          uVar6 = uVar5;
        }
        pcVar1->data[(int)(uVar6 + pcVar1->w * iVar8)] = iVar9;
        uVar5 = uVar5 + 1;
      }
    } while (local_68.i < ((local_68.s)->_M_dataplus)._M_p + (local_68.s)->_M_string_length);
  }
  return;
}

Assistant:

cg_box(s_i raw, int sep, int just, int fill, bool &empty) {
        int maxrow = 0, nrows = 0, rlen = 0;
        for (s_i x = raw; !x.atEnd(); ) {
            if (x.get() == sep) {
                maxrow = max(maxrow, rlen);
                rlen = 0;
                nrows++;
            } else {
                rlen++;
            }
        }
        if (rlen) {
            maxrow = max(maxrow, rlen);
            nrows++;
        }
        empty = maxrow < 1;
        if (empty) fill = OUT_CHAR;
        w = max(1, maxrow);
        h = max(1, nrows);
        data = new int[w*h];
        for (int i = 0; i < w*h; i++) data[i] = fill;

        int row = 0, col = 0;
        for (s_i x = raw; !x.atEnd();) {
            int c = x.get();
            if (c == sep) {
                col = 0;
                row++;
            } else {
                data[w*row + (just == 1 ? w - 1 - col : col)] = c;
                col++;
            }
        }
    }